

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O1

void __thiscall SQArray::Append(SQArray *this,SQObject *o)

{
  SQUnsignedInteger *pSVar1;
  uint uVar2;
  uint uVar3;
  SQObjectPtr *pSVar4;
  SQObjectPtr *pSVar5;
  ulong uVar6;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = o->_type;
  local_28.super_SQObject._flags = o->_flags;
  local_28.super_SQObject._5_3_ = *(undefined3 *)&o->field_0x5;
  local_28.super_SQObject._unVal = (SQObjectValue)(o->_unVal).pTable;
  if ((local_28.super_SQObject._0_8_ & 0x8000000) != 0) {
    pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  uVar2 = (this->_values)._size;
  uVar3 = (this->_values)._allocated;
  if (uVar3 <= uVar2) {
    uVar2 = uVar2 * 2;
    uVar6 = 4;
    if (uVar2 != 0) {
      uVar6 = (ulong)uVar2;
    }
    pSVar5 = (SQObjectPtr *)
             sq_vm_realloc((this->_values)._alloc_ctx,(this->_values)._vals,(ulong)uVar3 << 4,
                           uVar6 << 4);
    (this->_values)._vals = pSVar5;
    (this->_values)._allocated = (size_type)uVar6;
  }
  pSVar4 = (this->_values)._vals;
  uVar2 = (this->_values)._size;
  (this->_values)._size = uVar2 + 1;
  pSVar5 = pSVar4 + uVar2;
  (pSVar5->super_SQObject)._type = local_28.super_SQObject._type;
  (pSVar5->super_SQObject)._flags = local_28.super_SQObject._flags;
  *(undefined3 *)&(pSVar5->super_SQObject).field_0x5 = local_28.super_SQObject._5_3_;
  (pSVar5->super_SQObject)._unVal.pTable = (SQTable *)local_28.super_SQObject._unVal;
  if ((pSVar4[uVar2].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar4[uVar2].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return;
}

Assistant:

void Append(const SQObject &o){_values.push_back(o); VT_PUSHBACK(o, _ss(this)->_root_vm); }